

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::PointLight>::lerp
          (LightNodeImpl<embree::SceneGraph::PointLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long *plVar18;
  _func_int **pp_Var19;
  long *in_RDX;
  long *plVar20;
  float fVar21;
  
  bVar1 = true;
  if (*in_RDX == 0) {
    plVar20 = (long *)0x0;
  }
  else {
    plVar18 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
    plVar20 = (long *)0x0;
    if (plVar18 != (long *)0x0) {
      (**(code **)(*plVar18 + 0x10))(plVar18);
      bVar1 = false;
      plVar20 = plVar18;
    }
  }
  pp_Var19 = (_func_int **)alignedMalloc(0xa0,0x10);
  fVar21 = 1.0 - f;
  fVar2 = *(float *)(plVar20 + 0x10);
  fVar3 = *(float *)((long)plVar20 + 0x84);
  fVar4 = *(float *)(plVar20 + 0x11);
  fVar5 = *(float *)((long)plVar20 + 0x8c);
  fVar6 = *(float *)&light1_in[0x10].ptr;
  fVar7 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar8 = *(float *)&light1_in[0x11].ptr;
  fVar9 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar10 = *(float *)(plVar20 + 0x12);
  fVar11 = *(float *)((long)plVar20 + 0x94);
  fVar12 = *(float *)(plVar20 + 0x13);
  fVar13 = *(float *)((long)plVar20 + 0x9c);
  fVar14 = *(float *)&light1_in[0x12].ptr;
  fVar15 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar16 = *(float *)&light1_in[0x13].ptr;
  fVar17 = *(float *)((long)&light1_in[0x13].ptr + 4);
  pp_Var19[1] = (_func_int *)0x0;
  pp_Var19[2] = (_func_int *)(pp_Var19 + 4);
  pp_Var19[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var19 + 4) = 0;
  pp_Var19[6] = (_func_int *)(pp_Var19 + 8);
  pp_Var19[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var19 + 8) = 0;
  pp_Var19[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var19 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var19 + 0x5c) = 0xffffffff;
  pp_Var19[0xc] = (_func_int *)0x0;
  *pp_Var19 = (_func_int *)&PTR__Node_002c58a8;
  *(undefined4 *)(pp_Var19 + 0xe) = 1;
  *(float *)(pp_Var19 + 0x10) = fVar6 * fVar21 + fVar2 * f;
  *(float *)((long)pp_Var19 + 0x84) = fVar7 * fVar21 + fVar3 * f;
  *(float *)(pp_Var19 + 0x11) = fVar8 * fVar21 + fVar4 * f;
  *(float *)((long)pp_Var19 + 0x8c) = fVar9 * fVar21 + fVar5 * f;
  *(float *)(pp_Var19 + 0x12) = fVar21 * fVar14 + f * fVar10;
  *(float *)((long)pp_Var19 + 0x94) = fVar21 * fVar15 + f * fVar11;
  *(float *)(pp_Var19 + 0x13) = fVar21 * fVar16 + f * fVar12;
  *(float *)((long)pp_Var19 + 0x9c) = fVar21 * fVar17 + f * fVar13;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var19;
  LOCK();
  pp_Var19[1] = pp_Var19[1] + 1;
  UNLOCK();
  if (!bVar1) {
    (**(code **)(*plVar20 + 0x18))(plVar20);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }